

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numbers.h
# Opt level: O0

bool __thiscall
absl::lts_20240722::numbers_internal::safe_strtoi_base<int>
          (numbers_internal *this,string_view s,Nonnull<int_*> out,int base)

{
  byte bVar1;
  undefined4 local_2c;
  undefined1 local_27;
  undefined1 local_26;
  int32_t val;
  bool kUse64Bit;
  bool kIsSigned;
  bool parsed;
  char *pcStack_20;
  int base_local;
  Nonnull<int_*> out_local;
  string_view s_local;
  
  pcStack_20 = s._M_str;
  s_local._M_len = s._M_len;
  val = (int32_t)out;
  local_26 = 1;
  local_27 = 0;
  out_local = (Nonnull<int_*>)this;
  bVar1 = absl::lts_20240722::numbers_internal::safe_strto32_base
                    (this,s_local._M_len,&local_2c,(ulong)out & 0xffffffff);
  *(undefined4 *)pcStack_20 = local_2c;
  return (bool)(bVar1 & 1);
}

Assistant:

ABSL_MUST_USE_RESULT bool safe_strtoi_base(absl::string_view s,
                                           absl::Nonnull<int_type*> out,
                                           int base) {
  static_assert(sizeof(*out) == 4 || sizeof(*out) == 8,
                "SimpleAtoi works only with 32-bit or 64-bit integers.");
  static_assert(!std::is_floating_point<int_type>::value,
                "Use SimpleAtof or SimpleAtod instead.");
  bool parsed;
  // TODO(jorg): This signed-ness check is used because it works correctly
  // with enums, and it also serves to check that int_type is not a pointer.
  // If one day something like std::is_signed<enum E> works, switch to it.
  // These conditions are constexpr bools to suppress MSVC warning C4127.
  constexpr bool kIsSigned = static_cast<int_type>(1) - 2 < 0;
  constexpr bool kUse64Bit = sizeof(*out) == 64 / 8;
  if (kIsSigned) {
    if (kUse64Bit) {
      int64_t val;
      parsed = numbers_internal::safe_strto64_base(s, &val, base);
      *out = static_cast<int_type>(val);
    } else {
      int32_t val;
      parsed = numbers_internal::safe_strto32_base(s, &val, base);
      *out = static_cast<int_type>(val);
    }
  } else {
    if (kUse64Bit) {
      uint64_t val;
      parsed = numbers_internal::safe_strtou64_base(s, &val, base);
      *out = static_cast<int_type>(val);
    } else {
      uint32_t val;
      parsed = numbers_internal::safe_strtou32_base(s, &val, base);
      *out = static_cast<int_type>(val);
    }
  }
  return parsed;
}